

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  REF_BOOL available;
  REF_INT version;
  REF_FILEPOS next_position;
  REF_LONG ncell;
  REF_INT dim;
  REF_FILEPOS key_pos [156];
  int local_538;
  REF_INT local_534;
  size_t local_530;
  REF_GLOB local_528;
  undefined1 local_51c [4];
  REF_FILEPOS local_518 [157];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_530 = 0xffffffffffffffff;
  sVar4 = strlen(filename);
  iVar1 = strcmp(filename + (sVar4 - 6),".meshb");
  if (iVar1 != 0) {
    pcVar7 = "expected .meshb extension";
    uVar2 = 3;
    uVar5 = 0x3f5;
    uVar6 = 3;
    goto LAB_001f85b6;
  }
  if (ref_mpi->id == 0) {
    uVar2 = ref_import_meshb_header(filename,&local_534,local_518);
    if (uVar2 == 0) {
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x3fe,"ref_part_cad_discrete_edge","unable to open file");
        return 2;
      }
      uVar2 = ref_import_meshb_jump
                        ((FILE *)__stream,local_534,local_518,3,&local_538,(REF_FILEPOS *)&local_530
                        );
      if (uVar2 == 0) {
        if (local_538 == 0) {
          pcVar7 = "meshb missing dimension";
          uVar5 = 0x402;
          goto LAB_001f8566;
        }
        sVar4 = fread(local_51c,4,1,__stream);
        if (sVar4 != 1) {
          pcVar7 = "dim";
          sVar8 = 1;
          uVar5 = 0x403;
          goto LAB_001f841f;
        }
        goto LAB_001f81d2;
      }
      pcVar7 = "jump";
      uVar5 = 0x401;
    }
    else {
      pcVar7 = "header";
      uVar5 = 0x3f9;
    }
  }
  else {
    __stream = (FILE *)0x0;
LAB_001f81d2:
    uVar2 = ref_mpi_bcast(ref_mpi,&local_534,1,1);
    if (uVar2 == 0) {
      uVar2 = ref_cell_free(ref_grid->cell[0]);
      if (uVar2 == 0) {
        uVar2 = ref_cell_create(ref_grid->cell,REF_CELL_EDG);
        if (uVar2 == 0) {
          if (ref_grid->mpi->id == 0) {
            uVar2 = ref_import_meshb_jump
                              ((FILE *)__stream,local_534,local_518,5,&local_538,
                               (REF_FILEPOS *)&local_530);
            if (uVar2 != 0) {
              pcVar7 = "jump";
              uVar5 = 0x40e;
              goto LAB_001f85b3;
            }
            if ((local_538 != 0) &&
               (RVar3 = ref_part_meshb_long((FILE *)__stream,local_534,&local_528), RVar3 != 0)) {
              pcVar7 = "ncell";
              uVar2 = 1;
              uVar5 = 0x410;
              uVar6 = 1;
              goto LAB_001f85b6;
            }
          }
          uVar2 = ref_mpi_bcast(ref_mpi,&local_538,1,1);
          if (uVar2 == 0) {
            if (local_538 == 0) {
              pcVar7 = "no edge available in meshb";
              uVar5 = 0x416;
LAB_001f8566:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar5,"ref_part_cad_discrete_edge",pcVar7);
              return 1;
            }
            uVar2 = ref_mpi_bcast(ref_mpi,&local_528,1,2);
            if (uVar2 == 0) {
              uVar2 = ref_part_meshb_cell_bcast
                                (ref_grid->cell[0],local_528,ref_node,local_534,(FILE *)__stream);
              sVar8 = local_530;
              if (uVar2 == 0) {
                if (ref_grid->mpi->id != 0) {
                  return 0;
                }
                sVar4 = ftello(__stream);
                if (sVar8 == sVar4) {
                  fclose(__stream);
                  return 0;
                }
                pcVar7 = "end location";
                uVar5 = 0x41f;
LAB_001f841f:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar5,"ref_part_cad_discrete_edge",pcVar7,sVar8,sVar4);
                return 1;
              }
              pcVar7 = "part cell";
              uVar5 = 0x41c;
            }
            else {
              pcVar7 = "bcast";
              uVar5 = 0x418;
            }
          }
          else {
            pcVar7 = "bcast";
            uVar5 = 0x414;
          }
        }
        else {
          pcVar7 = "edg";
          uVar5 = 0x409;
        }
      }
      else {
        pcVar7 = "clear out edge";
        uVar5 = 0x408;
      }
    }
    else {
      pcVar7 = "bcast";
      uVar5 = 0x406;
    }
  }
LAB_001f85b3:
  uVar6 = (ulong)uVar2;
LAB_001f85b6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
         "ref_part_cad_discrete_edge",uVar6,pcVar7);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_LONG ncell;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "clear out edge");
  RSS(ref_cell_create(&ref_grid_edg(ref_grid), REF_CELL_EDG), "edg");

  if (ref_grid_once(ref_grid)) {
    RSS(ref_import_meshb_jump(file, version, key_pos, 5, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_long(file, version, &ncell), "ncell");
      if (verbose) printf("nedge %ld\n", ncell);
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "no edge available in meshb");

  RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_GLOB_TYPE), "bcast");

  RSS(ref_part_meshb_cell_bcast(ref_grid_edg(ref_grid), ncell, ref_node,
                                version, file),
      "part cell");

  if (ref_grid_once(ref_grid)) {
    REIS(next_position, ftello(file), "end location");
    fclose(file);
  }

  return REF_SUCCESS;
}